

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O1

FT_UInt ps_unicodes_char_index(PS_Unicodes table,FT_UInt32 unicode)

{
  PS_UniMap *pPVar1;
  uint uVar2;
  PS_UniMap *pPVar3;
  PS_UniMap *pPVar4;
  PS_UniMap *pPVar5;
  PS_UniMap *pPVar6;
  PS_UniMap *pPVar7;
  uint uVar8;
  
  pPVar3 = table->maps;
  pPVar4 = pPVar3 + table->num_maps;
  pPVar5 = (PS_UniMap *)0x0;
  pPVar6 = pPVar3 + (table->num_maps >> 1);
  do {
    if (pPVar4 <= pPVar3) break;
    uVar2 = pPVar6->unicode;
    pPVar7 = pPVar6;
    if (uVar2 != unicode) {
      uVar8 = unicode - (uVar2 & 0x7fffffff);
      if (uVar8 == 0) {
        pPVar5 = pPVar6;
      }
      pPVar7 = pPVar6 + 1;
      if (unicode < (uVar2 & 0x7fffffff) || uVar8 == 0) {
        pPVar4 = pPVar6;
        pPVar7 = pPVar3;
      }
      pPVar3 = pPVar7;
      pPVar1 = pPVar6 + uVar8;
      pPVar7 = pPVar1;
      if (pPVar1 < pPVar3) {
        pPVar7 = pPVar3 + ((long)pPVar4 - (long)pPVar3 >> 4);
      }
      pPVar6 = pPVar5;
      if (pPVar4 <= pPVar1) {
        pPVar7 = pPVar3 + ((long)pPVar4 - (long)pPVar3 >> 4);
      }
    }
    pPVar5 = pPVar6;
    pPVar6 = pPVar7;
  } while (uVar2 != unicode);
  if (pPVar5 != (PS_UniMap *)0x0) {
    return pPVar5->glyph_index;
  }
  return 0;
}

Assistant:

static FT_UInt
  ps_unicodes_char_index( PS_Unicodes  table,
                          FT_UInt32    unicode )
  {
    PS_UniMap  *result = NULL;
    PS_UniMap  *min = table->maps;
    PS_UniMap  *max = min + table->num_maps;
    PS_UniMap  *mid = min + ( ( max - min ) >> 1 );


    /* Perform a binary search on the table. */
    while ( min < max )
    {
      FT_UInt32  base_glyph;


      if ( mid->unicode == unicode )
      {
        result = mid;
        break;
      }

      base_glyph = BASE_GLYPH( mid->unicode );

      if ( base_glyph == unicode )
        result = mid; /* remember match but continue search for base glyph */

      if ( base_glyph < unicode )
        min = mid + 1;
      else
        max = mid;

      /* reasonable prediction in a continuous block */
      mid += unicode - base_glyph;
      if ( mid >= max || mid < min )
        mid = min + ( ( max - min ) >> 1 );
    }

    if ( result )
      return result->glyph_index;
    else
      return 0;
  }